

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

void TranslateBlock(ExpressionTranslateContext *ctx,ExprBlock *expression)

{
  ExprBase *expression_00;
  IntrusiveList<ExprBase> *pIVar1;
  
  Print(ctx,"{");
  PrintLine(ctx);
  ctx->depth = ctx->depth + 1;
  pIVar1 = &expression->expressions;
  while (expression_00 = pIVar1->head, expression_00 != (ExprBase *)0x0) {
    PrintIndent(ctx);
    Translate(ctx,expression_00);
    Print(ctx,";");
    PrintLine(ctx);
    pIVar1 = (IntrusiveList<ExprBase> *)&expression_00->next;
  }
  if (expression->closures != (ExprBase *)0x0) {
    PrintIndentedLine(ctx,"// Closures");
    PrintIndent(ctx);
    Translate(ctx,expression->closures);
    Print(ctx,";");
    PrintLine(ctx);
  }
  ctx->depth = ctx->depth - 1;
  PrintIndent(ctx);
  Print(ctx,"}");
  return;
}

Assistant:

void TranslateBlock(ExpressionTranslateContext &ctx, ExprBlock *expression)
{
	Print(ctx, "{");
	PrintLine(ctx);

	ctx.depth++;

	for(ExprBase *value = expression->expressions.head; value; value = value->next)
	{
		PrintIndent(ctx);

		Translate(ctx, value);

		Print(ctx, ";");

		PrintLine(ctx);
	}

	if(expression->closures)
	{
		PrintIndentedLine(ctx, "// Closures");

		PrintIndent(ctx);

		Translate(ctx, expression->closures);
		Print(ctx, ";");

		PrintLine(ctx);
	}

	ctx.depth--;

	PrintIndent(ctx);
	Print(ctx, "}");
}